

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:155:17)>
::destroy(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:155:17)>
          *this)

{
  TransformPromiseNodeBase::dropDependency(&this->super_TransformPromiseNodeBase);
  TransformPromiseNodeBase::~TransformPromiseNodeBase(&this->super_TransformPromiseNodeBase);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }